

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  byte bVar1;
  ImGuiTableColumn *pIVar2;
  ImGuiTableColumnSortSpecs *pIVar3;
  ImGuiTableColumnSortSpecs *local_58;
  ImGuiTableColumnSortSpecs *local_50;
  int local_44;
  ImGuiTableColumnSortSpecs *sort_spec;
  ImGuiTableColumn *column;
  int column_n;
  ImGuiTableColumnSortSpecs *sort_specs;
  bool dirty;
  ImGuiTable *table_local;
  
  bVar1 = table->IsSortSpecsDirty & 1;
  if (bVar1 != 0) {
    TableSortSpecsSanitize(table);
    if (table->SortSpecsCount < '\x02') {
      local_44 = 0;
    }
    else {
      local_44 = (int)table->SortSpecsCount;
    }
    ImVector<ImGuiTableColumnSortSpecs>::resize(&table->SortSpecsMulti,local_44);
    (table->SortSpecs).SpecsDirty = true;
    table->IsSortSpecsDirty = false;
  }
  if (table->SortSpecsCount == '\0') {
    local_50 = (ImGuiTableColumnSortSpecs *)0x0;
  }
  else {
    if (table->SortSpecsCount == '\x01') {
      local_58 = &table->SortSpecsSingle;
    }
    else {
      local_58 = (table->SortSpecsMulti).Data;
    }
    local_50 = local_58;
  }
  if ((bVar1 != 0) && (local_50 != (ImGuiTableColumnSortSpecs *)0x0)) {
    for (column._4_4_ = 0; column._4_4_ < table->ColumnsCount; column._4_4_ = column._4_4_ + 1) {
      pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column._4_4_);
      if (pIVar2->SortOrder != -1) {
        if (table->SortSpecsCount <= pIVar2->SortOrder) {
          __assert_fail("column->SortOrder < table->SortSpecsCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_tables.cpp"
                        ,0xadb,"void ImGui::TableSortSpecsBuild(ImGuiTable *)");
        }
        pIVar3 = local_50 + pIVar2->SortOrder;
        pIVar3->ColumnUserID = pIVar2->UserID;
        pIVar3->ColumnIndex = (short)(char)column._4_4_;
        pIVar3->SortOrder = (short)pIVar2->SortOrder;
        pIVar3->field_0x8 = pIVar2->field_0x65 & 3;
      }
    }
  }
  (table->SortSpecs).Specs = local_50;
  (table->SortSpecs).SpecsCount = (int)table->SortSpecsCount;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    bool dirty = table->IsSortSpecsDirty;
    if (dirty)
    {
        TableSortSpecsSanitize(table);
        table->SortSpecsMulti.resize(table->SortSpecsCount <= 1 ? 0 : table->SortSpecsCount);
        table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
        table->IsSortSpecsDirty = false; // Mark as not dirty for us
    }

    // Write output
    ImGuiTableColumnSortSpecs* sort_specs = (table->SortSpecsCount == 0) ? NULL : (table->SortSpecsCount == 1) ? &table->SortSpecsSingle : table->SortSpecsMulti.Data;
    if (dirty && sort_specs != NULL)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->SortOrder == -1)
                continue;
            IM_ASSERT(column->SortOrder < table->SortSpecsCount);
            ImGuiTableColumnSortSpecs* sort_spec = &sort_specs[column->SortOrder];
            sort_spec->ColumnUserID = column->UserID;
            sort_spec->ColumnIndex = (ImGuiTableColumnIdx)column_n;
            sort_spec->SortOrder = (ImGuiTableColumnIdx)column->SortOrder;
            sort_spec->SortDirection = column->SortDirection;
        }

    table->SortSpecs.Specs = sort_specs;
    table->SortSpecs.SpecsCount = table->SortSpecsCount;
}